

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O0

_Bool xdr_call_encode(XDR *xdrs,rpc_msg *cmsg)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t *local_30;
  int32_t *buf;
  opaque_auth *oa;
  rpc_msg *cmsg_local;
  XDR *xdrs_local;
  
  if ((cmsg->cb_cred).oa_length < 0x191) {
    if ((cmsg->cb_verf).oa_length < 0x191) {
      puVar3 = (uint32_t *)
               xdr_inline_encode(xdrs,(ulong)(((cmsg->cb_cred).oa_length + 3 & 0xfffffffc) + 0x28 +
                                             ((cmsg->cb_verf).oa_length + 3 & 0xfffffffc)));
      if (puVar3 == (uint32_t *)0x0) {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_call_encode",0x78);
        }
        _Var1 = xdr_putuint32(xdrs,cmsg->rm_xid);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_xid %u","xdr_call_encode",0x7c,(ulong)cmsg->rm_xid);
          }
          return false;
        }
        _Var1 = xdr_putenum(xdrs,cmsg->rm_direction);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_direction %u","xdr_call_encode",0x83,
                       (ulong)cmsg->rm_direction);
          }
          return false;
        }
        _Var1 = xdr_putuint32(xdrs,(cmsg->ru).RM_cmb.cb_rpcvers);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_call.cb_rpcvers %u","xdr_call_encode",0x8a,
                       (ulong)(cmsg->ru).RM_cmb.cb_rpcvers);
          }
          return false;
        }
        if ((cmsg->ru).RM_cmb.cb_rpcvers != 2) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_encode",0x91,
                       (ulong)(cmsg->ru).RM_cmb.cb_rpcvers,2);
          }
          return false;
        }
        _Var1 = xdr_putuint32(xdrs,cmsg->cb_prog);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR cb_prog %u","xdr_call_encode",0x99,(ulong)cmsg->cb_prog);
          }
          return false;
        }
        _Var1 = xdr_putuint32(xdrs,cmsg->cb_vers);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR cb_vers %u","xdr_call_encode",0xa0,(ulong)cmsg->cb_vers);
          }
          return false;
        }
        _Var1 = xdr_putuint32(xdrs,cmsg->cb_proc);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR cb_proc %u","xdr_call_encode",0xa7,(ulong)cmsg->cb_proc);
          }
          return false;
        }
        _Var1 = xdr_opaque_auth_encode(xdrs,&cmsg->cb_cred);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_encode",0xae);
          }
          return false;
        }
        _Var1 = xdr_opaque_auth_encode(xdrs,&cmsg->cb_verf);
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_encode",0xb4);
          }
          return false;
        }
      }
      else {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_call_encode",0x55);
        }
        uVar2 = htonl(cmsg->rm_xid);
        *puVar3 = uVar2;
        uVar2 = htonl(cmsg->rm_direction);
        puVar3[1] = uVar2;
        uVar2 = htonl((cmsg->ru).RM_cmb.cb_rpcvers);
        puVar3[2] = uVar2;
        if ((cmsg->ru).RM_cmb.cb_rpcvers != 2) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_encode",0x5c,
                       (ulong)(cmsg->ru).RM_cmb.cb_rpcvers,2);
          }
          return false;
        }
        uVar2 = htonl(cmsg->cb_prog);
        puVar3[3] = uVar2;
        uVar2 = htonl(cmsg->cb_vers);
        puVar3[4] = uVar2;
        uVar2 = htonl(cmsg->cb_proc);
        puVar3[5] = uVar2;
        uVar2 = htonl((cmsg->cb_cred).oa_flavor);
        puVar3[6] = uVar2;
        uVar2 = htonl((cmsg->cb_cred).oa_length);
        local_30 = puVar3 + 8;
        puVar3[7] = uVar2;
        if ((cmsg->cb_cred).oa_length != 0) {
          memcpy(local_30,(cmsg->cb_cred).oa_body,(ulong)(cmsg->cb_cred).oa_length);
          local_30 = local_30 + ((cmsg->cb_cred).oa_length + 3 >> 2);
        }
        uVar2 = htonl((cmsg->cb_verf).oa_flavor);
        *local_30 = uVar2;
        uVar2 = htonl((cmsg->cb_verf).oa_length);
        local_30[1] = uVar2;
        if ((cmsg->cb_verf).oa_length != 0) {
          memcpy(local_30 + 2,(cmsg->cb_verf).oa_body,(ulong)(cmsg->cb_verf).oa_length);
        }
      }
      xdrs_local._7_1_ = true;
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR cb_verf.oa_length (%u) > %u","xdr_call_encode",0x49,
                   (ulong)(cmsg->cb_verf).oa_length,400);
      }
      xdrs_local._7_1_ = false;
    }
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR cb_cred.oa_length (%u) > %u","xdr_call_encode",0x41,
                 (ulong)(cmsg->cb_cred).oa_length,400);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

bool
xdr_call_encode(XDR *xdrs, struct rpc_msg *cmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	if (cmsg->cb_cred.oa_length > MAX_AUTH_BYTES) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_cred.oa_length (%u) > %u",
			__func__, __LINE__,
			cmsg->cb_cred.oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}
	if (cmsg->cb_verf.oa_length > MAX_AUTH_BYTES) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_verf.oa_length (%u) > %u",
			__func__, __LINE__,
			cmsg->cb_verf.oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}
	buf = xdr_inline_encode(xdrs, 8 * BYTES_PER_XDR_UNIT
					+ RNDUP(cmsg->cb_cred.oa_length)
					+ 2 * BYTES_PER_XDR_UNIT
					+ RNDUP(cmsg->cb_verf.oa_length));
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		IXDR_PUT_INT32(buf, cmsg->rm_xid);
		IXDR_PUT_ENUM(buf, cmsg->rm_direction);
		IXDR_PUT_INT32(buf, cmsg->rm_call.cb_rpcvers);
		if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers,
				RPC_MSG_VERSION);
			return (false);
		}
		IXDR_PUT_INT32(buf, cmsg->cb_prog);
		IXDR_PUT_INT32(buf, cmsg->cb_vers);
		IXDR_PUT_INT32(buf, cmsg->cb_proc);
		oa = &cmsg->cb_cred;
		IXDR_PUT_ENUM(buf, oa->oa_flavor);
		IXDR_PUT_INT32(buf, oa->oa_length);
		if (oa->oa_length) {
			memcpy(buf, oa->oa_body, oa->oa_length);
			buf += RNDUP(oa->oa_length) / sizeof (int32_t);
		}
		oa = &cmsg->cb_verf;
		IXDR_PUT_ENUM(buf, oa->oa_flavor);
		IXDR_PUT_INT32(buf, oa->oa_length);
		if (oa->oa_length) {
			memcpy(buf, oa->oa_body, oa->oa_length);
			/* no real need....
			buf += RNDUP(oa->oa_length) / sizeof (int32_t);
			*/
		}
	} else {
		/* nTI-RPC handles multiple buffers */
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, cmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				cmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, cmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				cmsg->rm_direction);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->rm_call.cb_rpcvers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers);
			return (false);
		}
		if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers,
				RPC_MSG_VERSION);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_prog %u",
				__func__, __LINE__,
				cmsg->cb_prog);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_vers %u",
				__func__, __LINE__,
				cmsg->cb_vers);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_proc %u",
				__func__, __LINE__,
				cmsg->cb_proc);
			return (false);
		}
		if (!xdr_opaque_auth_encode(xdrs, &(cmsg->cb_cred))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_opaque_auth_encode(xdrs, &(cmsg->cb_verf))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
	}
	return (true);
}